

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

UInt32 Backward(CLzmaEnc *p,UInt32 *backRes,UInt32 cur)

{
  UInt32 UVar1;
  UInt32 UVar2;
  bool bVar3;
  UInt32 backCur;
  UInt32 posPrev;
  UInt32 backMem;
  UInt32 posMem;
  UInt32 cur_local;
  UInt32 *backRes_local;
  CLzmaEnc *p_local;
  
  posMem = p->opt[cur].posPrev;
  backMem = p->opt[cur].backPrev;
  p->optimumEndIndex = cur;
  cur_local = cur;
  do {
    if (p->opt[cur_local].prev1IsChar != 0) {
      p->opt[posMem].backPrev = 0xffffffff;
      p->opt[posMem].prev1IsChar = 0;
      p->opt[posMem].posPrev = posMem - 1;
      if (p->opt[cur_local].prev2 != 0) {
        p->opt[posMem - 1].prev1IsChar = 0;
        p->opt[posMem - 1].posPrev = p->opt[cur_local].posPrev2;
        p->opt[posMem - 1].backPrev = p->opt[cur_local].backPrev2;
      }
    }
    UVar1 = p->opt[posMem].backPrev;
    UVar2 = p->opt[posMem].posPrev;
    p->opt[posMem].backPrev = backMem;
    p->opt[posMem].posPrev = cur_local;
    cur_local = posMem;
    bVar3 = posMem != 0;
    backMem = UVar1;
    posMem = UVar2;
  } while (bVar3);
  *backRes = p->opt[0].backPrev;
  p->optimumCurrentIndex = p->opt[0].posPrev;
  return p->optimumCurrentIndex;
}

Assistant:

static UInt32 Backward(CLzmaEnc *p, UInt32 *backRes, UInt32 cur)
{
  UInt32 posMem = p->opt[cur].posPrev;
  UInt32 backMem = p->opt[cur].backPrev;
  p->optimumEndIndex = cur;
  do
  {
    if (p->opt[cur].prev1IsChar)
    {
      MakeAsChar(&p->opt[posMem])
      p->opt[posMem].posPrev = posMem - 1;
      if (p->opt[cur].prev2)
      {
        p->opt[posMem - 1].prev1IsChar = False;
        p->opt[posMem - 1].posPrev = p->opt[cur].posPrev2;
        p->opt[posMem - 1].backPrev = p->opt[cur].backPrev2;
      }
    }
    {
      UInt32 posPrev = posMem;
      UInt32 backCur = backMem;
      
      backMem = p->opt[posPrev].backPrev;
      posMem = p->opt[posPrev].posPrev;
      
      p->opt[posPrev].backPrev = backCur;
      p->opt[posPrev].posPrev = cur;
      cur = posPrev;
    }
  }
  while (cur != 0);
  *backRes = p->opt[0].backPrev;
  p->optimumCurrentIndex  = p->opt[0].posPrev;
  return p->optimumCurrentIndex;
}